

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_concat.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_2::detail::
concat<std::__cxx11::string,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[18]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char (*args) [14],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [18])

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  strlen((char *)args_1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)*args);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(std::forward<Args>(args)...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}